

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_double_suite::test_linear_decrease(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  double *in_stack_ffffffffffffffb8;
  double local_40;
  char local_38 [8];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '$';
  local_38[7] = '@';
  local_40 = 10.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x98,0x10e2fe,local_38,&local_40,in_stack_ffffffffffffffb8,predicate);
  local_38[0] = -0x11;
  local_38[1] = -0x12;
  local_38[2] = -0x12;
  local_38[3] = -0x12;
  local_38[4] = -0x12;
  local_38[5] = -0x12;
  local_38[6] = '\"';
  local_38[7] = '@';
  local_40 = 9.46667;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","9.46667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x9a,0x10e2fe,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_00);
  local_38[0] = -0x26;
  local_38[1] = -0x10;
  local_38[2] = -7;
  local_38[3] = 'c';
  local_38[4] = -0x72;
  local_38[5] = -0x2e;
  local_38[6] = '!';
  local_38[7] = '@';
  local_40 = 8.91124;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","8.91124","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x9c,0x10e2fe,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_01);
  local_38[0] = -0x80;
  local_38[1] = -0x51;
  local_38[2] = -0x36;
  local_38[3] = -2;
  local_38[4] = -9;
  local_38[5] = -0x56;
  local_38[6] = ' ';
  local_38[7] = '@';
  local_40 = 8.33392;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","8.33392","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x9e,0x10e2fe,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_02);
  local_38[0] = '-';
  local_38[1] = -0x31;
  local_38[2] = -0x7d;
  local_38[3] = 'V';
  local_38[4] = -0x62;
  local_38[5] = -0x10;
  local_38[6] = '\x1e';
  local_38[7] = '@';
  local_40 = 7.73498;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","7.73498","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xa0,0x10e2fe,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_03);
  local_38[0] = -0x45;
  local_38[1] = 'n';
  local_38[2] = 's';
  local_38[3] = 'b';
  local_38[4] = -0x7f;
  local_38[5] = 'u';
  local_38[6] = '\x1c';
  local_38[7] = '@';
  local_40 = 7.11475;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","7.11475","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xa2,0x10e2fe,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_04);
  local_38[0] = -0x53;
  local_38[1] = 'X';
  local_38[2] = -0x24;
  local_38[3] = 'Q';
  local_38[4] = '\x04';
  local_38[5] = -0x1b;
  local_38[6] = '\x19';
  local_38[7] = '@';
  local_40 = 6.47365;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.47365","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xa4,0x10e2fe,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_05);
  local_38[0] = '\x1f';
  local_38[1] = -0x20;
  local_38[2] = -0x58;
  local_38[3] = -0x52;
  local_38[4] = -0x5e;
  local_38[5] = '?';
  local_38[6] = '\x17';
  local_38[7] = '@';
  local_40 = 5.81214;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.81214","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xa6,0x10e2fe,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_06);
  local_38[0] = -0xe;
  local_38[1] = '\x1d';
  local_38[2] = '?';
  local_38[3] = -0x14;
  local_38[4] = -0x1a;
  local_38[5] = -0x7b;
  local_38[6] = '\x14';
  local_38[7] = '@';
  local_40 = 5.13076;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.13076","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xa8,0x10e2fe,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_07);
  local_38[0] = 'R';
  local_38[1] = 'O';
  local_38[2] = '\v';
  local_38[3] = -0x29;
  local_38[4] = 'h';
  local_38[5] = -0x48;
  local_38[6] = '\x11';
  local_38[7] = '@';
  local_40 = 4.43009;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","4.43009","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xaa,0x10e2fe,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_08);
  return;
}

Assistant:

void test_linear_decrease()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment<double> filter(one_over_eight);

    filter.push(10.0);
    TRIAL_TEST_WITH(filter.mean(), 10.0, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.mean(), 9.46667, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.mean(), 8.91124, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.mean(), 8.33392, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.mean(), 7.73498, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 7.11475, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.mean(), 6.47365, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.mean(), 5.81214, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 5.13076, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 4.43009, tolerance);
}